

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CryptoNight_x86.h
# Opt level: O2

void xmrig::cryptonight_single_hash<true>
               (uint8_t *input,size_t size,uint8_t *output,cryptonight_ctx **ctx,uint64_t height,
               uint64_t extra_iters)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint8_t *l;
  ulong uVar5;
  ulong uVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  long lVar9;
  long lVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  __m128i bx0;
  __m128i bx1;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  __m128i *cx_00;
  ulong uVar19;
  ulong uVar20;
  bool bVar21;
  ulong uVar22;
  longlong extraout_XMM0_Qa;
  ulong uVar23;
  longlong extraout_XMM0_Qb;
  ulong uVar24;
  ulong uVar25;
  ulong uVar26;
  ulong uVar27;
  ulong uVar28;
  ulong uVar29;
  __m128i ax0;
  cryptonight_ctx *input_00;
  longlong lVar30;
  longlong lVar31;
  ulong local_a8;
  __m128i cx;
  
  input_00 = *ctx;
  keccak(input,size,input_00->state);
  cn_explode_scratchpad<true>((__m128i *)input_00,(__m128i *)input_00->memory);
  l = input_00->memory;
  local_a8 = *(ulong *)((long)input_00->state + 0x60);
  lVar30 = *(longlong *)((long)input_00->state + 0x68);
  lVar31 = 0;
  fesetround(0x400);
  uVar25 = *(ulong *)((long)input_00->state + 0x20) ^ *(ulong *)input_00->state;
  uVar27 = *(ulong *)((long)input_00->state + 0x28) ^ *(longlong *)((long)input_00->state + 8);
  uVar17 = extra_iters + 0x40000 >> 1 & 0xffffffff;
  uVar28 = *(ulong *)((long)input_00->state + 0x50) ^ *(ulong *)((long)input_00->state + 0x40);
  uVar29 = *(ulong *)((long)input_00->state + 0x58) ^ *(ulong *)((long)input_00->state + 0x48);
  uVar24 = *(ulong *)((long)input_00->state + 0x30) ^ *(ulong *)((long)input_00->state + 0x10);
  uVar26 = *(ulong *)((long)input_00->state + 0x38) ^ *(ulong *)((long)input_00->state + 0x18);
  while (bVar21 = uVar17 != 0, uVar17 = uVar17 - 1, bVar21) {
    uVar15 = uVar25 & 0xffff0;
    uVar1 = *(uint *)(l + uVar15);
    uVar2 = *(uint *)(l + uVar15 + 4);
    uVar3 = *(uint *)(l + uVar15 + 8);
    uVar4 = *(uint *)(l + uVar15 + 0xc);
    cx_00 = (__m128i *)(ulong)(uVar4 >> 0x16 & 0xfffffffc);
    ax0[1]._0_4_ = saes_table[1][uVar3 >> 8 & 0xff] ^ saes_table[0][uVar2 & 0xff] ^
                   *(uint *)((long)saes_table[2] + (ulong)(uVar4 >> 0xe & 0x3fc)) ^
                   *(uint *)((long)saes_table[3] + (ulong)(uVar1 >> 0x16 & 0xfffffffc));
    uVar22 = CONCAT44((uint)ax0[1],
                      saes_table[1][uVar2 >> 8 & 0xff] ^ saes_table[0][uVar1 & 0xff] ^
                      *(uint *)((long)saes_table[2] + (ulong)(uVar3 >> 0xe & 0x3fc)) ^
                      (uint)cx_00[0x198e3][0]);
    uVar22 = uVar22 ^ uVar25;
    uVar23 = CONCAT44(saes_table[1][uVar1 >> 8 & 0xff] ^ saes_table[0][uVar4 & 0xff] ^
                      *(uint *)((long)saes_table[2] + (ulong)(uVar2 >> 0xe & 0x3fc)) ^
                      *(uint *)((long)saes_table[3] + (ulong)(uVar3 >> 0x16 & 0xfffffffc)),
                      saes_table[1][uVar4 >> 8 & 0xff] ^ saes_table[0][uVar3 & 0xff] ^
                      *(uint *)((long)saes_table[2] + (ulong)(uVar1 >> 0xe & 0x3fc)) ^
                      *(uint *)((long)saes_table[3] + (ulong)(uVar2 >> 0x16 & 0xfffffffc))) ^ uVar27
    ;
    bx0[1] = (longlong)output;
    bx0[0] = (longlong)input_00;
    bx1[1] = lVar31;
    bx1[0] = lVar30;
    ax0[0] = (longlong)cx;
    ax0[1]._4_4_ = 0;
    cx[0] = uVar22;
    cx[1] = uVar23;
    cryptonight_monero_tweak((uint64_t *)(l + uVar15),l,uVar15,ax0,bx0,bx1,cx_00);
    uVar19 = uVar22 & 0xffff0;
    uVar20 = lVar30 << 0x20 ^ local_a8 ^ *(ulong *)(l + uVar19);
    uVar15 = (ulong)(uint)((int)uVar22 + (int)lVar30 * 2) | 0x80000001;
    local_a8 = uVar23 / uVar15 & 0xffffffff | uVar23 % uVar15 << 0x20;
    uVar15 = *(ulong *)(l + uVar19 + 8);
    int_sqrt_v2(local_a8 + uVar22);
    auVar7._8_8_ = 0;
    auVar7._0_8_ = uVar22;
    auVar8._8_8_ = 0;
    auVar8._0_8_ = uVar20;
    uVar16 = SUB168(auVar7 * auVar8,8);
    uVar14 = SUB168(auVar7 * auVar8,0);
    uVar12 = *(ulong *)(l + (uVar19 ^ 0x10));
    uVar13 = *(ulong *)((long)(l + (uVar19 ^ 0x10)) + 8);
    uVar18 = uVar19 ^ 0x20;
    uVar5 = *(ulong *)(l + uVar18);
    uVar6 = *(ulong *)(l + uVar18 + 8);
    lVar9 = *(long *)((long)(l + (uVar19 ^ 0x30)) + 8);
    lVar10 = *(long *)(l + uVar18);
    lVar11 = *(long *)((long)(l + uVar18) + 8);
    *(ulong *)(l + (uVar19 ^ 0x10)) = uVar28 + *(long *)(l + (uVar19 ^ 0x30));
    *(ulong *)((long)(l + (uVar19 ^ 0x10)) + 8) = uVar29 + lVar9;
    *(ulong *)(l + uVar18) = (uVar16 ^ uVar12) + uVar24;
    *(ulong *)((long)(l + uVar18) + 8) = (uVar14 ^ uVar13) + uVar26;
    *(ulong *)(l + (uVar19 ^ 0x30)) = lVar10 + uVar25;
    *(ulong *)((long)(l + (uVar19 ^ 0x30)) + 8) = lVar11 + uVar27;
    uVar25 = (uVar16 ^ uVar5) + uVar25;
    uVar27 = (uVar14 ^ uVar6) + uVar27;
    *(ulong *)(l + uVar19) = uVar25;
    *(ulong *)((long)(l + uVar19) + 8) = uVar27;
    uVar25 = uVar20 ^ uVar25;
    uVar27 = uVar15 ^ uVar27;
    uVar28 = uVar24;
    uVar29 = uVar26;
    uVar24 = uVar22;
    uVar26 = uVar23;
    lVar30 = extraout_XMM0_Qa;
    lVar31 = extraout_XMM0_Qb;
  }
  cn_implode_scratchpad<true>((__m128i *)input_00->memory,(__m128i *)input_00);
  keccakf((uint64_t *)input_00,0x18);
  switch(input_00->state[0] & 3) {
  case 0:
    blake256_hash(output,input_00->state,200);
    return;
  case 1:
    groestl(input_00->state,0x640,output);
    return;
  case 2:
    jh_hash(0x100,input_00->state,0x640,output);
    return;
  case 3:
    xmr_skein(input_00->state,output);
    return;
  }
}

Assistant:

inline void cryptonight_single_hash(const uint8_t *__restrict__ input, size_t size, uint8_t *__restrict__ output, cryptonight_ctx **__restrict__ ctx, uint64_t height, uint64_t extra_iters)
{
    constexpr CnAlgo props;
    constexpr size_t MASK        = props.mask();

    uint32_t iters = (props.iterations() + extra_iters) >> 1;

    keccak(input, size, ctx[0]->state);
    cn_explode_scratchpad<SOFT_AES>(reinterpret_cast<const __m128i *>(ctx[0]->state), reinterpret_cast<__m128i *>(ctx[0]->memory));

    uint64_t *h0 = reinterpret_cast<uint64_t*>(ctx[0]->state);
    uint8_t *l0   = ctx[0]->memory;

    VARIANT2_INIT(0);
    VARIANT2_SET_ROUNDING_MODE();

    uint64_t al0  = h0[0] ^ h0[4];
    uint64_t ah0  = h0[1] ^ h0[5];
    uint64_t idx0 = al0;
    __m128i bx0   = _mm_set_epi64x(static_cast<int64_t>(h0[3] ^ h0[7]), static_cast<int64_t>(h0[2] ^ h0[6]));
    __m128i bx1   = _mm_set_epi64x(static_cast<int64_t>(h0[9] ^ h0[11]), static_cast<int64_t>(h0[8] ^ h0[10]));

    for (size_t i = 0; i < iters; i++) {
        __m128i cx;
        if (!SOFT_AES) {
            cx = _mm_load_si128(reinterpret_cast<const __m128i *>(&l0[idx0 & MASK]));
        }

        const __m128i ax0 = _mm_set_epi64x(static_cast<int64_t>(ah0), static_cast<int64_t>(al0));
        if (SOFT_AES) {
            cx = soft_aesenc(&l0[idx0 & MASK], ax0, reinterpret_cast<const uint32_t*>(saes_table));
        }
        else {
            cx = _mm_aesenc_si128(cx, ax0);
        }

        cryptonight_monero_tweak(reinterpret_cast<uint64_t*>(&l0[idx0 & MASK]), l0, idx0 & MASK, ax0, bx0, bx1, cx);

        idx0 = static_cast<uint64_t>(_mm_cvtsi128_si64(cx));

        uint64_t hi, lo, cl, ch;
        cl = (reinterpret_cast<uint64_t*>(&l0[idx0 & MASK]))[0];
        ch = (reinterpret_cast<uint64_t*>(&l0[idx0 & MASK]))[1];

        VARIANT2_INTEGER_MATH(0, cl, cx);

        lo = __umul128(idx0, cl, &hi);

        VARIANT2_SHUFFLE2(l0, idx0 & MASK, ax0, bx0, bx1, hi, lo, 0);

        al0 += hi;
        ah0 += lo;

        reinterpret_cast<uint64_t*>(&l0[idx0 & MASK])[0] = al0;
        reinterpret_cast<uint64_t*>(&l0[idx0 & MASK])[1] = ah0;

        al0 ^= cl;
        ah0 ^= ch;
        idx0 = al0;
        bx1 = bx0;

        bx0 = cx;
    }

    cn_implode_scratchpad<SOFT_AES>(reinterpret_cast<const __m128i *>(ctx[0]->memory), reinterpret_cast<__m128i *>(ctx[0]->state));
    keccakf(h0, 24);
    extra_hashes[ctx[0]->state[0] & 3](ctx[0]->state, 200, output);
}